

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

_Bool fy_node_uses_single_input_only(fy_node *fyn,fy_input *fyi)

{
  _Bool _Var1;
  fy_input *pfVar2;
  list_head *plVar3;
  fy_node *fyn_00;
  
  if (fyi == (fy_input *)0x0 || fyn == (fy_node *)0x0) {
    return false;
  }
  switch(fyn->field_0x34 & 3) {
  case 0:
    if ((fyn->field_12).scalar == (fy_token *)0x0) {
      pfVar2 = (fy_input *)0x0;
    }
    else {
      pfVar2 = (((fyn->field_12).scalar)->handle).fyi;
    }
    return pfVar2 == fyi;
  case 1:
    if ((fyn->field_13).sequence_start == (fy_token *)0x0) {
      pfVar2 = (fy_input *)0x0;
    }
    else {
      pfVar2 = (((fyn->field_13).sequence_start)->handle).fyi;
    }
    if (pfVar2 != fyi) {
      return false;
    }
    fyn_00 = (fy_node *)&fyn->field_12;
    while( true ) {
      fyn_00 = (fy_node *)(fyn_00->node).next;
      if (fyn_00 == (fy_node *)&fyn->field_12) {
        fyn_00 = (fy_node *)0x0;
      }
      if (fyn_00 == (fy_node *)0x0) break;
      _Var1 = fy_node_uses_single_input_only(fyn_00,fyi);
      if (!_Var1) {
        return false;
      }
    }
    break;
  case 2:
    if ((fyn->field_13).sequence_start == (fy_token *)0x0) {
      pfVar2 = (fy_input *)0x0;
    }
    else {
      pfVar2 = (((fyn->field_13).sequence_start)->handle).fyi;
    }
    if (pfVar2 != fyi) {
      return false;
    }
    plVar3 = (list_head *)&fyn->field_12;
    while( true ) {
      plVar3 = ((list_head *)&plVar3->next)->next;
      if (plVar3 == (list_head *)&fyn->field_12) {
        plVar3 = (list_head *)0x0;
      }
      if (plVar3 == (list_head *)0x0) break;
      if (((fy_node *)plVar3[1].next != (fy_node *)0x0) &&
         (_Var1 = fy_node_uses_single_input_only((fy_node *)plVar3[1].next,fyi), !_Var1)) {
        return false;
      }
      if (((fy_node *)plVar3[1].prev != (fy_node *)0x0) &&
         (_Var1 = fy_node_uses_single_input_only((fy_node *)plVar3[1].prev,fyi), !_Var1)) {
        return false;
      }
    }
    break;
  case 3:
    goto LAB_0011c969;
  }
  if ((fyn->field_14).sequence_end == (fy_token *)0x0) {
    pfVar2 = (fy_input *)0x0;
  }
  else {
    pfVar2 = (((fyn->field_14).sequence_end)->handle).fyi;
  }
  if (pfVar2 != fyi) {
    return false;
  }
LAB_0011c969:
  return true;
}

Assistant:

bool fy_node_uses_single_input_only(struct fy_node *fyn, struct fy_input *fyi) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp;

    if (!fyn || !fyi)
        return false;

    switch (fyn->type) {
        case FYNT_SCALAR:
            return fy_token_get_input(fyn->scalar) == fyi;

        case FYNT_SEQUENCE:
            if (fy_token_get_input(fyn->sequence_start) != fyi)
                return false;

            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                if (!fy_node_uses_single_input_only(fyni, fyi))
                    return false;
            }

            if (fy_token_get_input(fyn->sequence_end) != fyi)
                return false;
            break;

        case FYNT_MAPPING:
            if (fy_token_get_input(fyn->mapping_start) != fyi)
                return false;

            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp;
                 fynp = fy_node_pair_next(&fyn->mapping, fynp)) {

                if (fynp->key && !fy_node_uses_single_input_only(fynp->key, fyi))
                    return false;

                if (fynp->value && !fy_node_uses_single_input_only(fynp->value, fyi))
                    return false;
            }

            if (fy_token_get_input(fyn->mapping_end) != fyi)
                return false;

            break;
    }

    return true;
}